

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator_factory.hpp
# Opt level: O3

unique_ptr<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::make_type_validator
          (keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *context,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *parent)

{
  json_type jVar1;
  int iVar2;
  type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *this_00;
  runtime_error *prVar3;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_R8;
  iterator this_01;
  const_array_range_type cVar7;
  vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  expected_types;
  type type;
  string keyword;
  uri schema_location;
  vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  local_1a8;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  _Tuple_impl<0UL,_jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  uri local_c0;
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_150.
  super__Head_base<0UL,_jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
        )(_Head_base<0UL,_jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
          )this;
  local_e8 = in_R8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"type","");
  local_c0.uri_string_._M_dataplus._M_p = (pointer)&local_c0.uri_string_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,*(long *)&sch->field_0,
             &(((sch->field_0).long_str_.ptr_)->
              super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>).field_0x0 +
             *(long *)&sch->field_0);
  local_c0.scheme_part_.first = *(unsigned_long *)&sch[2].field_0;
  local_c0.scheme_part_.second = sch[2].field_0.int64_.val_;
  local_c0.userinfo_part_.first = *(unsigned_long *)&sch[3].field_0;
  local_c0.userinfo_part_.second = sch[3].field_0.int64_.val_;
  local_c0.host_part_.first = *(unsigned_long *)&sch[4].field_0;
  local_c0.host_part_.second = sch[4].field_0.int64_.val_;
  local_c0.port_part_.first = *(unsigned_long *)&sch[5].field_0;
  local_c0.port_part_.second = sch[5].field_0.int64_.val_;
  local_c0.path_part_.first = *(unsigned_long *)&sch[6].field_0;
  local_c0.path_part_.second = sch[6].field_0.int64_.val_;
  local_c0.query_part_.first = *(unsigned_long *)&sch[7].field_0;
  local_c0.query_part_.second = sch[7].field_0.int64_.val_;
  local_c0.fragment_part_.first = *(unsigned_long *)&sch[8].field_0;
  local_c0.fragment_part_.second = sch[8].field_0.int64_.val_;
  local_1a8.
  super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (json_schema_type *)0x0;
  local_1a8.
  super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (json_schema_type *)0x0;
  jVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type(parent);
  if (jVar1 != string_value) {
    if (jVar1 == array_value) {
      cVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
              array_range(parent);
      this_01 = cVar7.first_._M_current;
      if (this_01._M_current != cVar7.last_._M_current._M_current) {
        do {
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          as_string<std::allocator<char>>
                    (&local_170,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     this_01._M_current,(allocator<char> *)&local_190);
          iVar2 = std::__cxx11::string::compare((char *)&local_170);
          if (iVar2 == 0) {
            local_190 = (long *)((ulong)local_190 & 0xffffffff00000000);
            if (local_1a8.
                super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_1a8.
                super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              *local_1a8.
               super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
               ._M_impl.super__Vector_impl_data._M_finish = null;
              goto LAB_00454576;
            }
            std::
            vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
            ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                      (&local_1a8,
                       (iterator)
                       local_1a8.
                       super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(json_schema_type *)&local_190);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_170);
            if (iVar2 == 0) {
              local_190 = (long *)CONCAT44(local_190._4_4_,1);
              if (local_1a8.
                  super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_1a8.
                  super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                *local_1a8.
                 super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                 ._M_impl.super__Vector_impl_data._M_finish = object;
                goto LAB_00454576;
              }
              std::
              vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
              ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                        (&local_1a8,
                         (iterator)
                         local_1a8.
                         super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(json_schema_type *)&local_190);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_170);
              if (iVar2 == 0) {
                local_190 = (long *)CONCAT44(local_190._4_4_,2);
                if (local_1a8.
                    super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_1a8.
                    super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  *local_1a8.
                   super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                   ._M_impl.super__Vector_impl_data._M_finish = array;
                  goto LAB_00454576;
                }
                std::
                vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                          (&local_1a8,
                           (iterator)
                           local_1a8.
                           super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(json_schema_type *)&local_190
                          );
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_170);
                if (iVar2 == 0) {
                  local_190 = (long *)CONCAT44(local_190._4_4_,3);
                  if (local_1a8.
                      super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      local_1a8.
                      super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    *local_1a8.
                     super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                     ._M_impl.super__Vector_impl_data._M_finish = string;
                    goto LAB_00454576;
                  }
                  std::
                  vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                  ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                            (&local_1a8,
                             (iterator)
                             local_1a8.
                             super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (json_schema_type *)&local_190);
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)&local_170);
                  if (iVar2 == 0) {
                    local_190 = (long *)CONCAT44(local_190._4_4_,4);
                    if (local_1a8.
                        super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                        ._M_impl.super__Vector_impl_data._M_finish !=
                        local_1a8.
                        super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      *local_1a8.
                       super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                       ._M_impl.super__Vector_impl_data._M_finish = boolean;
                      goto LAB_00454576;
                    }
                    std::
                    vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                    ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                              (&local_1a8,
                               (iterator)
                               local_1a8.
                               super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (json_schema_type *)&local_190);
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)&local_170);
                    if (iVar2 == 0) {
                      local_190 = (long *)CONCAT44(local_190._4_4_,5);
                      if (local_1a8.
                          super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          local_1a8.
                          super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        *local_1a8.
                         super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                         ._M_impl.super__Vector_impl_data._M_finish = integer;
                        goto LAB_00454576;
                      }
                      std::
                      vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                      ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                                (&local_1a8,
                                 (iterator)
                                 local_1a8.
                                 super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 (json_schema_type *)&local_190);
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)&local_170);
                      if (iVar2 != 0) {
                        prVar3 = (runtime_error *)__cxa_allocate_exception(0x18);
                        std::operator+(&local_148,&local_c0.uri_string_,": ");
                        plVar4 = (long *)std::__cxx11::string::append((char *)&local_148);
                        local_128._M_dataplus._M_p = (pointer)*plVar4;
                        psVar5 = (size_type *)(plVar4 + 2);
                        if ((size_type *)local_128._M_dataplus._M_p == psVar5) {
                          local_128.field_2._M_allocated_capacity = *psVar5;
                          local_128.field_2._8_8_ = plVar4[3];
                          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                        }
                        else {
                          local_128.field_2._M_allocated_capacity = *psVar5;
                        }
                        local_128._M_string_length = plVar4[1];
                        *plVar4 = (long)psVar5;
                        plVar4[1] = 0;
                        *(undefined1 *)(plVar4 + 2) = 0;
                        std::operator+(&local_e0,&local_128,&local_170);
                        plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
                        local_190 = (long *)*plVar4;
                        plVar6 = plVar4 + 2;
                        if (local_190 == plVar6) {
                          local_180 = *plVar6;
                          lStack_178 = plVar4[3];
                          local_190 = &local_180;
                        }
                        else {
                          local_180 = *plVar6;
                        }
                        local_188 = plVar4[1];
                        *plVar4 = (long)plVar6;
                        plVar4[1] = 0;
                        *(undefined1 *)(plVar4 + 2) = 0;
                        *(undefined ***)(prVar3 + 0x10) = &PTR__json_exception_00b2f248;
                        std::runtime_error::runtime_error(prVar3,(string *)&local_190);
                        *(undefined8 *)prVar3 = 0xb40ec8;
                        *(undefined8 *)(prVar3 + 0x10) = 0xb40f00;
                        __cxa_throw(prVar3,&schema_error::typeinfo,schema_error::~schema_error);
                      }
                      local_190 = (long *)CONCAT44(local_190._4_4_,6);
                      if (local_1a8.
                          super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                          ._M_impl.super__Vector_impl_data._M_finish ==
                          local_1a8.
                          super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::
                        vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                        ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                                  (&local_1a8,
                                   (iterator)
                                   local_1a8.
                                   super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                   (json_schema_type *)&local_190);
                      }
                      else {
                        *local_1a8.
                         super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                         ._M_impl.super__Vector_impl_data._M_finish = number;
LAB_00454576:
                        local_1a8.
                        super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             local_1a8.
                             super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1;
                      }
                    }
                  }
                }
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          this_01._M_current = this_01._M_current + 0x10;
        } while (this_01._M_current != cVar7.last_._M_current._M_current);
      }
    }
    goto LAB_004547d4;
  }
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
  as_string<std::allocator<char>>
            (&local_170,
             (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)parent,
             (allocator<char> *)&local_190);
  iVar2 = std::__cxx11::string::compare((char *)&local_170);
  if (iVar2 == 0) {
    local_190 = (long *)((ulong)local_190 & 0xffffffff00000000);
    if (local_1a8.
        super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_1a8.
        super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      *local_1a8.
       super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
       ._M_impl.super__Vector_impl_data._M_finish = null;
      goto LAB_004547b0;
    }
    std::
    vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
    ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
              (&local_1a8,
               (iterator)
               local_1a8.
               super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
               ._M_impl.super__Vector_impl_data._M_finish,(json_schema_type *)&local_190);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_170);
    if (iVar2 == 0) {
      local_190 = (long *)CONCAT44(local_190._4_4_,1);
      if (local_1a8.
          super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_1a8.
          super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        *local_1a8.
         super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
         ._M_impl.super__Vector_impl_data._M_finish = object;
        goto LAB_004547b0;
      }
      std::
      vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
      ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                (&local_1a8,
                 (iterator)
                 local_1a8.
                 super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(json_schema_type *)&local_190);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_170);
      if (iVar2 == 0) {
        local_190 = (long *)CONCAT44(local_190._4_4_,2);
        if (local_1a8.
            super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_1a8.
            super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          *local_1a8.
           super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
           ._M_impl.super__Vector_impl_data._M_finish = array;
          goto LAB_004547b0;
        }
        std::
        vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
        ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                  (&local_1a8,
                   (iterator)
                   local_1a8.
                   super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(json_schema_type *)&local_190);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_170);
        if (iVar2 == 0) {
          local_190 = (long *)CONCAT44(local_190._4_4_,3);
          if (local_1a8.
              super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_1a8.
              super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            *local_1a8.
             super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
             ._M_impl.super__Vector_impl_data._M_finish = string;
            goto LAB_004547b0;
          }
          std::
          vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
          ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                    (&local_1a8,
                     (iterator)
                     local_1a8.
                     super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(json_schema_type *)&local_190);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_170);
          if (iVar2 == 0) {
            local_190 = (long *)CONCAT44(local_190._4_4_,4);
            if (local_1a8.
                super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_1a8.
                super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              *local_1a8.
               super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
               ._M_impl.super__Vector_impl_data._M_finish = boolean;
              goto LAB_004547b0;
            }
            std::
            vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
            ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                      (&local_1a8,
                       (iterator)
                       local_1a8.
                       super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(json_schema_type *)&local_190);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_170);
            if (iVar2 == 0) {
              local_190 = (long *)CONCAT44(local_190._4_4_,5);
              if (local_1a8.
                  super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_1a8.
                  super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                *local_1a8.
                 super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                 ._M_impl.super__Vector_impl_data._M_finish = integer;
                goto LAB_004547b0;
              }
              std::
              vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
              ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                        (&local_1a8,
                         (iterator)
                         local_1a8.
                         super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(json_schema_type *)&local_190);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_170);
              if (iVar2 != 0) {
                prVar3 = (runtime_error *)__cxa_allocate_exception(0x18);
                std::operator+(&local_148,&local_c0.uri_string_,": ");
                plVar4 = (long *)std::__cxx11::string::append((char *)&local_148);
                local_128._M_dataplus._M_p = (pointer)*plVar4;
                psVar5 = (size_type *)(plVar4 + 2);
                if ((size_type *)local_128._M_dataplus._M_p == psVar5) {
                  local_128.field_2._M_allocated_capacity = *psVar5;
                  local_128.field_2._8_8_ = plVar4[3];
                  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                }
                else {
                  local_128.field_2._M_allocated_capacity = *psVar5;
                }
                local_128._M_string_length = plVar4[1];
                *plVar4 = (long)psVar5;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                std::operator+(&local_e0,&local_128,&local_170);
                plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
                local_190 = (long *)*plVar4;
                plVar6 = plVar4 + 2;
                if (local_190 == plVar6) {
                  local_180 = *plVar6;
                  lStack_178 = plVar4[3];
                  local_190 = &local_180;
                }
                else {
                  local_180 = *plVar6;
                }
                local_188 = plVar4[1];
                *plVar4 = (long)plVar6;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                *(undefined ***)(prVar3 + 0x10) = &PTR__json_exception_00b2f248;
                std::runtime_error::runtime_error(prVar3,(string *)&local_190);
                *(undefined8 *)prVar3 = 0xb40ec8;
                *(undefined8 *)(prVar3 + 0x10) = 0xb40f00;
                __cxa_throw(prVar3,&schema_error::typeinfo,schema_error::~schema_error);
              }
              local_190 = (long *)CONCAT44(local_190._4_4_,6);
              if (local_1a8.
                  super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_1a8.
                  super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ::_M_realloc_insert<jsoncons::jsonschema::json_schema_type>
                          (&local_1a8,
                           (iterator)
                           local_1a8.
                           super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(json_schema_type *)&local_190
                          );
              }
              else {
                *local_1a8.
                 super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                 ._M_impl.super__Vector_impl_data._M_finish = number;
LAB_004547b0:
                local_1a8.
                super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_1a8.
                     super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
LAB_004547d4:
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::get_custom_message
            (&local_170,
             (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)sch,&local_108);
  this_00 = (type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)operator_new(0x100);
  type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::type_validator(this_00,local_e8,&local_c0,&local_170,&local_1a8);
  (((keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
     *)local_150.
       super__Head_base<0UL,_jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
       ._M_head_impl)->
  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ).super_validation_message_factory._vptr_validation_message_factory = (_func_int **)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8.
      super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.uri_string_._M_dataplus._M_p != &local_c0.uri_string_.field_2) {
    operator_delete(local_c0.uri_string_._M_dataplus._M_p,
                    local_c0.uri_string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return (unique_ptr<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          )local_150.
           super__Head_base<0UL,_jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
           ._M_head_impl._M_head_impl;
}

Assistant:

std::unique_ptr<type_validator<Json>> make_type_validator(const compilation_context<Json>& context,
            const Json& sch, const Json& parent)
        {
            std::string keyword = "type";
            uri schema_location = context.get_base_uri();
            
            std::vector<json_schema_type> expected_types;

            switch (sch.type()) 
            { 
                case json_type::string_value: 
                {
                    auto type = sch.template as<std::string>();
                    if (type == "null")
                    {
                        expected_types.push_back(json_schema_type::null);
                    }
                    else if (type == "object")
                    {
                        expected_types.push_back(json_schema_type::object);
                    }
                    else if (type == "array")
                    {
                        expected_types.push_back(json_schema_type::array);
                    }
                    else if (type == "string")
                    {
                        expected_types.push_back(json_schema_type::string);
                    }
                    else if (type == "boolean")
                    {
                        expected_types.push_back(json_schema_type::boolean);
                    }
                    else if (type == "integer")
                    {
                        expected_types.push_back(json_schema_type::integer);
                    }
                    else if (type == "number")
                    {
                        expected_types.push_back(json_schema_type::number);
                    }
                    else
                    {
                        JSONCONS_THROW(schema_error(schema_location.string() + ": " + "Invalid type '" + type + "'"));
                    }
                    break;
                } 

                case json_type::array_value: // "type": ["type1", "type2"]
                {
                    for (const auto& item : sch.array_range())
                    {
                        auto type = item.template as<std::string>();
                        if (type == "null")
                        {
                            expected_types.push_back(json_schema_type::null);
                        }
                        else if (type == "object")
                        {
                            expected_types.push_back(json_schema_type::object);
                        }
                        else if (type == "array")
                        {
                            expected_types.push_back(json_schema_type::array);
                        }
                        else if (type == "string")
                        {
                            expected_types.push_back(json_schema_type::string);
                        }
                        else if (type == "boolean")
                        {
                            expected_types.push_back(json_schema_type::boolean);
                        }
                        else if (type == "integer")
                        {
                            expected_types.push_back(json_schema_type::integer);
                        }
                        else if (type == "number")
                        {
                            expected_types.push_back(json_schema_type::number);
                        }
                        else
                        {
                            JSONCONS_THROW(schema_error(schema_location.string() + ": " + "Invalid type '" + type + "'"));
                        }
                    }
                    break;
                }
                default:
                    break;
            }
            
            return jsoncons::make_unique<type_validator<Json>>(parent, std::move(schema_location), context.get_custom_message(keyword), 
                std::move(expected_types));
        }